

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O2

void __thiscall
Imf_3_4::Image::resize
          (Image *this,Box2i *dataWindow,LevelMode levelMode,LevelRoundingMode levelRoundingMode)

{
  ImageLevel *pIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  _Base_ptr p_Var5;
  int x;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  Box2i levelDataWindow;
  
  clearLevels(this);
  if (levelMode == ONE_LEVEL) {
    uVar10 = 1;
    uVar11 = uVar10;
  }
  else if (levelMode == RIPMAP_LEVELS) {
    iVar8 = anon_unknown_8::roundLog2
                      (((dataWindow->max).x - (dataWindow->min).x) + 1,levelRoundingMode);
    iVar2 = anon_unknown_8::roundLog2
                      (((dataWindow->max).y - (dataWindow->min).y) + 1,levelRoundingMode);
    uVar10 = iVar2 + 1;
    uVar11 = iVar8 + 1;
  }
  else if (levelMode == MIPMAP_LEVELS) {
    iVar2 = ((dataWindow->max).x - (dataWindow->min).x) + 1;
    iVar8 = ((dataWindow->max).y - (dataWindow->min).y) + 1;
    if (iVar8 < iVar2) {
      iVar8 = iVar2;
    }
    iVar8 = anon_unknown_8::roundLog2(iVar8,levelRoundingMode);
    uVar10 = iVar8 + 1;
    uVar11 = uVar10;
  }
  else {
    uVar10 = 0;
    uVar11 = 0;
  }
  Array2D<Imf_3_4::ImageLevel_*>::resizeErase(&this->_levels,(long)(int)uVar10,(long)(int)uVar11);
  uVar9 = 0;
  uVar12 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar12 = uVar9;
  }
  uVar6 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar6 = uVar9;
  }
  for (; uVar9 != uVar6; uVar9 = uVar9 + 1) {
    for (uVar7 = 0; uVar7 != uVar12; uVar7 = uVar7 + 1) {
      if (uVar7 == uVar9 || levelMode != MIPMAP_LEVELS) {
        iVar8 = (dataWindow->min).x;
        iVar3 = anon_unknown_8::levelSize(iVar8,(dataWindow->max).x,(int)uVar7,levelRoundingMode);
        iVar2 = (dataWindow->min).y;
        iVar4 = anon_unknown_8::levelSize(iVar2,(dataWindow->max).y,(int)uVar9,levelRoundingMode);
        levelDataWindow.max.x = iVar3 + iVar8 + -1;
        levelDataWindow.max.y = iVar2 + -1 + iVar4;
        levelDataWindow.min.x = iVar8;
        levelDataWindow.min.y = iVar2;
        iVar8 = (*this->_vptr_Image[7])(this,uVar7 & 0xffffffff,uVar9 & 0xffffffff,&levelDataWindow)
        ;
        (this->_levels)._data[(this->_levels)._sizeY * uVar9 + uVar7] =
             (ImageLevel *)CONCAT44(extraout_var,iVar8);
        for (p_Var5 = (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != &(this->_channels)._M_t._M_impl.super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          pIVar1 = (this->_levels)._data[(this->_levels)._sizeY * uVar9 + uVar7];
          (*pIVar1->_vptr_ImageLevel[4])
                    (pIVar1,p_Var5 + 1,(ulong)p_Var5[2]._M_color,
                     (ulong)*(uint *)&p_Var5[2].field_0x4,(ulong)*(uint *)&p_Var5[2]._M_parent,
                     (ulong)*(byte *)((long)&p_Var5[2]._M_parent + 4));
        }
      }
      else {
        (this->_levels)._data[(this->_levels)._sizeY * uVar9 + uVar7] = (ImageLevel *)0x0;
      }
    }
  }
  (this->_dataWindow).min = dataWindow->min;
  (this->_dataWindow).max = dataWindow->max;
  this->_levelMode = levelMode;
  this->_levelRoundingMode = levelRoundingMode;
  return;
}

Assistant:

void
Image::resize (
    const Box2i&      dataWindow,
    LevelMode         levelMode,
    LevelRoundingMode levelRoundingMode)
{
    try
    {
        clearLevels ();

        int nx = computeNumXLevels (dataWindow, levelMode, levelRoundingMode);
        int ny = computeNumYLevels (dataWindow, levelMode, levelRoundingMode);

        _levels.resizeErase (ny, nx);

        for (int y = 0; y < ny; ++y)
        {
            for (int x = 0; x < nx; ++x)
            {
                if (levelMode == MIPMAP_LEVELS && x != y)
                {
                    _levels[y][x] = 0;
                    continue;
                }

                Box2i levelDataWindow = computeDataWindowForLevel (
                    dataWindow, x, y, levelRoundingMode);

                _levels[y][x] = newLevel (x, y, levelDataWindow);

                for (ChannelMap::iterator i = _channels.begin ();
                     i != _channels.end ();
                     ++i)
                {
                    _levels[y][x]->insertChannel (
                        i->first,
                        i->second.type,
                        i->second.xSampling,
                        i->second.ySampling,
                        i->second.pLinear);
                }
            }
        }

        _dataWindow        = dataWindow;
        _levelMode         = levelMode;
        _levelRoundingMode = levelRoundingMode;
    }
    catch (...)
    {
        clearLevels ();
        throw;
    }
}